

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

void shell_helper(char *cmd)

{
  undefined8 __s;
  allocator<char> local_551;
  string local_550;
  allocator<char> local_529;
  string local_528;
  undefined1 local_508 [8];
  limits_t limits;
  allocator<char> local_4c1;
  string local_4c0;
  undefined1 local_4a0 [8];
  process shell;
  char *cmd_local;
  
  shell._1160_8_ = cmd;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c0,"sh",&local_4c1);
  procxx::process::process<>((process *)local_4a0,&local_4c0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::allocator<char>::~allocator(&local_4c1);
  procxx::process::limits_t::limits_t((limits_t *)local_508);
  procxx::process::limits_t::cpu_time((limits_t *)local_508,2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,"-c",&local_529);
  procxx::process::add_argument((process *)local_4a0,&local_528);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator(&local_529);
  __s = shell._1160_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_550,(char *)__s,&local_551);
  procxx::process::add_argument((process *)local_4a0,&local_550);
  std::__cxx11::string::~string((string *)&local_550);
  std::allocator<char>::~allocator(&local_551);
  procxx::process::limit((process *)local_4a0,(limits_t *)local_508);
  procxx::process::exec((process *)local_4a0);
  procxx::process::~process((process *)local_4a0);
  return;
}

Assistant:

void shell_helper(const char* cmd) {
  procxx::process shell{"sh"};
  procxx::process::limits_t limits;
  limits.cpu_time(2);

  shell.add_argument("-c");
  shell.add_argument(cmd);

  shell.limit(limits);
  shell.exec();
}